

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DXFLoader.cpp
# Opt level: O1

void __thiscall
Assimp::DXFImporter::ParseBlocks(DXFImporter *this,LineReader *reader,FileData *output)

{
  int iVar1;
  Logger *this_00;
  LineReader *reader_00;
  long *local_1c8;
  long local_1b8 [2];
  undefined1 local_1a8 [376];
  
  iVar1 = reader->end;
  while (iVar1 < 2) {
    if (reader->groupcode == 0) {
      iVar1 = strcmp("ENDSEC",(reader->value)._M_dataplus._M_p);
      if (iVar1 == 0) break;
      iVar1 = strcmp("BLOCK",(reader->value)._M_dataplus._M_p);
      if (iVar1 != 0) goto LAB_0044759f;
      reader_00 = DXF::LineReader::operator++(reader);
      ParseBlock(this,reader_00,output);
    }
    else {
LAB_0044759f:
      DXF::LineReader::operator++(reader);
    }
    iVar1 = reader->end;
  }
  this_00 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[10]>
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
             (char (*) [10])"DXF: got ");
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," entries in BLOCKS",0x12)
  ;
  std::__cxx11::stringbuf::str();
  Logger::debug(this_00,(char *)local_1c8);
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8,local_1b8[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return;
}

Assistant:

void DXFImporter::ParseBlocks(DXF::LineReader& reader, DXF::FileData& output) {
    while( !reader.End() && !reader.Is(0,"ENDSEC")) {
        if (reader.Is(0,"BLOCK")) {
            ParseBlock(++reader,output);
            continue;
        }
        ++reader;
    }

    ASSIMP_LOG_DEBUG_F("DXF: got ", output.blocks.size()," entries in BLOCKS" );
}